

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirstWorkingReporter.cpp
# Opt level: O1

bool __thiscall
ApprovalTests::FirstWorkingReporter::report
          (FirstWorkingReporter *this,string *received,string *approved)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pcVar3;
  int iVar4;
  pointer psVar5;
  bool bVar6;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  psVar5 = (this->reporters).
           super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->reporters).
           super__Vector_base<std::shared_ptr<ApprovalTests::Reporter>,_std::allocator<std::shared_ptr<ApprovalTests::Reporter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = psVar5 != psVar1;
  if (bVar6) {
    do {
      peVar2 = (psVar5->super___shared_ptr<ApprovalTests::Reporter,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_50[0] = local_40;
      pcVar3 = (received->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar3,pcVar3 + received->_M_string_length);
      local_70[0] = local_60;
      pcVar3 = (approved->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar3,pcVar3 + approved->_M_string_length);
      iVar4 = (*peVar2->_vptr_Reporter[2])(peVar2,(string *)local_50,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if ((char)iVar4 != '\0') {
        return bVar6;
      }
      psVar5 = psVar5 + 1;
      bVar6 = psVar5 != psVar1;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool FirstWorkingReporter::report(std::string received, std::string approved) const
    {
        for (auto& r : reporters)
        {
            if (r->report(received, approved))
            {
                return true;
            }
        }
        return false;
    }